

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

bool __thiscall
Catch::Matchers::StdString::ContainsMatcher::match(ContainsMatcher *this,string *source)

{
  bool bVar1;
  string local_30;
  
  CasedString::adjustString(&local_30,&(this->super_StringMatcherBase).m_comparator,source);
  bVar1 = contains(&local_30,&(this->super_StringMatcherBase).m_comparator.m_str);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool ContainsMatcher::match( std::string const& source ) const {
            return contains( m_comparator.adjustString( source ), m_comparator.m_str );
        }